

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PerPatchDataCase::init
          (PerPatchDataCase *this,EVP_PKEY_CTX *ctx)

{
  size_type *psVar1;
  deInt32 *pdVar2;
  Context *pCVar3;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar4;
  bool bVar5;
  bool bVar6;
  RenderTarget *pRVar7;
  long *plVar8;
  undefined8 *puVar9;
  SharedPtrStateBase *pSVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  TestError *this_00;
  undefined1 usePointMode;
  size_type *psVar12;
  size_type *psVar13;
  size_type *psVar14;
  pointer pbVar15;
  ContextInfo *pCVar16;
  ulong *puVar17;
  Context *code;
  TessPrimitiveType extraout_EDX;
  TessPrimitiveType extraout_EDX_00;
  TessPrimitiveType extraout_EDX_01;
  TessPrimitiveType extraout_EDX_02;
  TessPrimitiveType primType;
  long extraout_RDX;
  char *__s;
  pointer pcVar18;
  undefined8 uVar19;
  deInt32 *pdVar20;
  long lVar21;
  string fragmentShaderTemplate;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  string outSizeStr;
  string inSizeStr;
  string local_3b0;
  string local_390;
  size_type *local_370;
  value_type local_368;
  size_type *local_348;
  value_type local_340;
  size_type *local_320;
  value_type local_318;
  ShaderProgram *local_2f8;
  undefined1 local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [32];
  Context *local_288;
  long local_280;
  Context local_278;
  long local_260;
  undefined1 local_258 [16];
  pointer local_248;
  undefined1 local_238 [16];
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [24];
  pointer pbStack_190;
  ios_base local_138 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_118;
  undefined1 local_f8 [200];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar7->m_width,
             (RenderTarget *)(ulong)(uint)pRVar7->m_height,0x100);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<((ostringstream *)local_1a8,10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_248 = (pointer)local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\n\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 &local_1e8);
  plVar8 = (long *)std::__cxx11::string::append(local_2f0);
  psVar1 = &local_340._M_string_length;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar12) {
    local_340._M_string_length = *psVar12;
    local_340.field_2._M_allocated_capacity = plVar8[3];
    local_348 = psVar1;
  }
  else {
    local_340._M_string_length = *psVar12;
    local_348 = (size_type *)*plVar8;
  }
  local_340._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_348);
  psVar12 = &local_368._M_string_length;
  psVar13 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar13) {
    local_368._M_string_length = *psVar13;
    local_368.field_2._M_allocated_capacity = plVar8[3];
    local_370 = psVar12;
  }
  else {
    local_368._M_string_length = *psVar13;
    local_370 = (size_type *)*plVar8;
  }
  local_368._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_370);
  psVar13 = &local_318._M_string_length;
  psVar14 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar14) {
    local_318._M_string_length = *psVar14;
    local_318.field_2._M_allocated_capacity = plVar8[3];
    local_320 = psVar13;
  }
  else {
    local_318._M_string_length = *psVar14;
    local_320 = (size_type *)*plVar8;
  }
  local_318._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)psVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_320);
  pbVar15 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pbVar15) {
    local_1a8._16_8_ = (pbVar15->_M_dataplus)._M_p;
    pbStack_190 = (pointer)plVar8[3];
    local_1a8._0_8_ = (pointer)(local_1a8 + 0x10);
  }
  else {
    local_1a8._16_8_ = (pbVar15->_M_dataplus)._M_p;
    local_1a8._0_8_ = (pointer)*plVar8;
  }
  local_1a8._8_8_ = plVar8[1];
  *plVar8 = (long)pbVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_1a8);
  local_278.m_contextInfo = (ContextInfo *)local_258;
  pCVar16 = (ContextInfo *)(plVar8 + 2);
  if ((ContextInfo *)*plVar8 == pCVar16) {
    local_258._0_8_ = pCVar16->_vptr_ContextInfo;
    local_258._8_8_ = plVar8[3];
  }
  else {
    local_258._0_8_ = pCVar16->_vptr_ContextInfo;
    local_278.m_contextInfo = (ContextInfo *)*plVar8;
  }
  lVar21 = plVar8[1];
  *plVar8 = (long)pCVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_260 = lVar21;
  if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1a8._16_8_)->_M_p + 1));
    lVar21 = extraout_RDX;
  }
  usePointMode = SUB81(pCVar16,0);
  primType = (TessPrimitiveType)lVar21;
  if (local_320 != psVar13) {
    operator_delete(local_320,local_318._M_string_length + 1);
    primType = extraout_EDX;
  }
  if (local_370 != psVar12) {
    operator_delete(local_370,local_368._M_string_length + 1);
    primType = extraout_EDX_00;
  }
  if (local_348 != psVar1) {
    operator_delete(local_348,local_340._M_string_length + 1);
    primType = extraout_EDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._0_8_ != &local_2e0) {
    operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
    primType = extraout_EDX_02;
  }
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)local_2a8,(_anonymous_namespace_ *)&DAT_00000001,primType,(bool)usePointMode)
  ;
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_2a8,0,(char *)0x0,0x1c4562f);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar11) {
    local_2e0._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2e0._8_8_ = plVar8[3];
    local_2f0._0_8_ = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2f0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_2f0._8_8_ = plVar8[1];
  *plVar8 = (long)paVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_2f0);
  puVar17 = (ulong *)(plVar8 + 2);
  if ((size_type *)*plVar8 == puVar17) {
    local_340._M_string_length = *puVar17;
    local_340.field_2._M_allocated_capacity = plVar8[3];
    local_348 = psVar1;
  }
  else {
    local_340._M_string_length = *puVar17;
    local_348 = (size_type *)*plVar8;
  }
  local_340._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)puVar17;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  if (this->m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_390,"patch in mediump int in_te_patchVerticesInFromTCS;\n","");
  }
  else if (this->m_caseType == CASETYPE_PRIMITIVE_ID_TCS) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_390,"patch in mediump int in_te_primitiveIDFromTCS;\n","");
  }
  else {
    local_390._M_string_length = 0;
    local_390.field_2._M_local_buf[0] = '\0';
  }
  pcVar18 = (pointer)0xf;
  if (local_348 != psVar1) {
    pcVar18 = (pointer)local_340._M_string_length;
  }
  if (pcVar18 < local_340._M_dataplus._M_p + local_390._M_string_length) {
    pcVar18 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      pcVar18 = (pointer)CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                                  local_390.field_2._M_local_buf[0]);
    }
    if (pcVar18 < local_340._M_dataplus._M_p + local_390._M_string_length) goto LAB_0140650a;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,(ulong)local_348);
  }
  else {
LAB_0140650a:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_390._M_dataplus._M_p);
  }
  psVar1 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar1) {
    local_368._M_string_length = *psVar1;
    local_368.field_2._M_allocated_capacity = puVar9[3];
    local_370 = psVar12;
  }
  else {
    local_368._M_string_length = *psVar1;
    local_370 = (size_type *)*puVar9;
  }
  local_368._M_dataplus._M_p = (pointer)puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_370);
  puVar17 = (ulong *)(plVar8 + 2);
  if ((size_type *)*plVar8 == puVar17) {
    local_318._M_string_length = *puVar17;
    local_318.field_2._M_allocated_capacity = plVar8[3];
    local_320 = psVar13;
  }
  else {
    local_318._M_string_length = *puVar17;
    local_320 = (size_type *)*plVar8;
  }
  local_318._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)puVar17;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  switch(this->m_caseType) {
  case CASETYPE_PRIMITIVE_ID_TCS:
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b0,"\tbool ok = in_te_primitiveIDFromTCS == 3;\n","");
    goto LAB_014066f7;
  case CASETYPE_PRIMITIVE_ID_TES:
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3b0,"\tbool ok = gl_PrimitiveID == 3;\n","");
LAB_014066f7:
    bVar6 = false;
    bVar5 = false;
    goto LAB_01406797;
  case CASETYPE_PATCH_VERTICES_IN_TCS:
    std::operator+(&local_2c8,"\tbool ok = in_te_patchVerticesInFromTCS == ",&local_1c8);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    puVar17 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_3b0.field_2._M_allocated_capacity = *puVar17;
      local_3b0.field_2._8_8_ = puVar9[3];
    }
    else {
      local_3b0.field_2._M_allocated_capacity = *puVar17;
      local_3b0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_3b0._M_string_length = puVar9[1];
    *puVar9 = puVar17;
    bVar6 = true;
    bVar5 = false;
    goto LAB_0140678a;
  case CASETYPE_PATCH_VERTICES_IN_TES:
    std::operator+(&local_2c8,"\tbool ok = gl_PatchVerticesIn == ",&local_1e8);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    puVar17 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_3b0.field_2._M_allocated_capacity = *puVar17;
      local_3b0.field_2._8_8_ = puVar9[3];
    }
    else {
      local_3b0.field_2._M_allocated_capacity = *puVar17;
      local_3b0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_3b0._M_string_length = puVar9[1];
    *puVar9 = puVar17;
    bVar5 = true;
    bVar6 = false;
LAB_0140678a:
    puVar9[1] = 0;
    *(undefined1 *)puVar17 = 0;
    goto LAB_01406797;
  case CASETYPE_TESS_LEVEL_INNER0_TES:
    __s = "\tbool ok = abs(gl_TessLevelInner[0] - 9.0) < 0.1f;\n";
    break;
  case CASETYPE_TESS_LEVEL_INNER1_TES:
    __s = "\tbool ok = abs(gl_TessLevelInner[1] - 8.0) < 0.1f;\n";
    break;
  case CASETYPE_TESS_LEVEL_OUTER0_TES:
    __s = "\tbool ok = abs(gl_TessLevelOuter[0] - 7.0) < 0.1f;\n";
    break;
  case CASETYPE_TESS_LEVEL_OUTER1_TES:
    __s = "\tbool ok = abs(gl_TessLevelOuter[1] - 6.0) < 0.1f;\n";
    break;
  case CASETYPE_TESS_LEVEL_OUTER2_TES:
    __s = "\tbool ok = abs(gl_TessLevelOuter[2] - 5.0) < 0.1f;\n";
    break;
  default:
    __s = (char *)0x0;
    if (this->m_caseType == CASETYPE_TESS_LEVEL_OUTER3_TES) {
      __s = "\tbool ok = abs(gl_TessLevelOuter[3] - 4.0) < 0.1f;\n";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,__s,(allocator<char> *)&local_2c8);
  bVar6 = false;
  bVar5 = false;
LAB_01406797:
  pcVar18 = (pointer)0xf;
  if (local_320 != psVar13) {
    pcVar18 = (pointer)local_318._M_string_length;
  }
  if (pcVar18 < local_318._M_dataplus._M_p + local_3b0._M_string_length) {
    uVar19 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      uVar19 = local_3b0.field_2._M_allocated_capacity;
    }
    if (local_318._M_dataplus._M_p + local_3b0._M_string_length <= (ulong)uVar19) {
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_3b0,0,(char *)0x0,(ulong)local_320);
      goto LAB_01406802;
    }
  }
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_320,(ulong)local_3b0._M_dataplus._M_p);
LAB_01406802:
  local_1a8._0_8_ = local_1a8 + 0x10;
  pbVar15 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pbVar15) {
    local_1a8._16_8_ = (pbVar15->_M_dataplus)._M_p;
    pbStack_190 = (pointer)plVar8[3];
  }
  else {
    local_1a8._16_8_ = (pbVar15->_M_dataplus)._M_p;
    local_1a8._0_8_ = (pointer)*plVar8;
  }
  local_1a8._8_8_ = plVar8[1];
  *plVar8 = (long)pbVar15;
  plVar8[1] = 0;
  *(undefined1 *)&(pbVar15->_M_dataplus)._M_p = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_1a8);
  local_288 = &local_278;
  code = (Context *)(plVar8 + 2);
  if ((Context *)*plVar8 == code) {
    local_278.m_testCtx = code->m_testCtx;
    local_278.m_renderCtx = (RenderContext *)plVar8[3];
  }
  else {
    local_278.m_testCtx = code->m_testCtx;
    local_288 = (Context *)*plVar8;
  }
  local_280 = plVar8[1];
  *plVar8 = (long)code;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((pointer)local_1a8._0_8_ != (pointer)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_1a8._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2)) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((bVar6) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2)) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if (local_320 != psVar13) {
    operator_delete(local_320,(ulong)(local_318._M_string_length + 1));
  }
  if (local_370 != psVar12) {
    operator_delete(local_370,local_368._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,
                    CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                             local_390.field_2._M_local_buf[0]) + 1);
  }
  if (local_348 != &local_340._M_string_length) {
    operator_delete(local_348,(ulong)(local_340._M_string_length + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._0_8_ != &local_2e0) {
    operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
  }
  if ((Context *)local_2a8._0_8_ != (Context *)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
  }
  local_2a8._0_8_ = (Context *)(local_2a8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a8,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  local_2f8 = (ShaderProgram *)operator_new(0xd0);
  pCVar3 = (this->super_TestCase).m_context;
  renderCtx = pCVar3->m_renderCtx;
  memset(local_1a8,0,0xac);
  local_f8._0_8_ = (pointer)0x0;
  local_f8[8] = 0;
  local_f8._9_7_ = 0;
  local_f8[0x10] = 0;
  local_f8._17_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_390,(_anonymous_namespace_ *)pCVar3->m_renderCtx,(Context *)local_248,
             (char *)code);
  local_320 = (size_type *)((ulong)local_320 & 0xffffffff00000000);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_318,local_390._M_dataplus._M_p,
             local_390._M_dataplus._M_p + local_390._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_320 & 0xffffffff) * 0x18),&local_318);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_3b0,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_278.m_contextInfo,(char *)code);
  local_370 = (size_type *)CONCAT44(local_370._4_4_,3);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_3b0._M_dataplus._M_p,
             local_3b0._M_dataplus._M_p + local_3b0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_370 & 0xffffffff) * 0x18),&local_368);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_208,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_288,(char *)code);
  local_348 = (size_type *)CONCAT44(local_348._4_4_,4);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,local_208._M_dataplus._M_p,
             local_208._M_dataplus._M_p + local_208._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + ((ulong)local_348 & 0xffffffff) * 0x18),&local_340);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)(local_238 + 0x10),
             (_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)local_2a8._0_8_,(char *)code);
  local_2f0._0_4_ = 1;
  local_2f0._8_8_ = local_2e0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2f0 + 8),local_228._M_dataplus._M_p,
             local_228._M_dataplus._M_p + local_228._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + (local_2f0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2f0 + 8));
  glu::ShaderProgram::ShaderProgram(local_2f8,renderCtx,(ProgramSources *)local_1a8);
  pSVar10 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar2 = &pSVar10->strongRefCount;
  pSVar10->strongRefCount = 0;
  pSVar10->weakRefCount = 0;
  pSVar10->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02137b98;
  pSVar10[1]._vptr_SharedPtrStateBase = (_func_int **)local_2f8;
  pSVar10->strongRefCount = 1;
  pSVar10->weakRefCount = 1;
  pSVar4 = (this->m_program).m_state;
  if (pSVar4 != pSVar10) {
    if (pSVar4 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar20 = &pSVar4->strongRefCount;
      *pdVar20 = *pdVar20 + -1;
      UNLOCK();
      if (*pdVar20 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar20 = &((this->m_program).m_state)->weakRefCount;
      *pdVar20 = *pdVar20 + -1;
      UNLOCK();
      if (*pdVar20 == 0) {
        pSVar4 = (this->m_program).m_state;
        if (pSVar4 != (SharedPtrStateBase *)0x0) {
          (*pSVar4->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = local_2f8;
    (this->m_program).m_state = pSVar10;
    LOCK();
    pSVar10->strongRefCount = pSVar10->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar20 = &((this->m_program).m_state)->weakRefCount;
    *pdVar20 = *pdVar20 + 1;
    UNLOCK();
  }
  pdVar20 = &pSVar10->weakRefCount;
  LOCK();
  *pdVar2 = *pdVar2 + -1;
  UNLOCK();
  if (*pdVar2 == 0) {
    (*pSVar10->_vptr_SharedPtrStateBase[2])(pSVar10);
  }
  LOCK();
  *pdVar20 = *pdVar20 + -1;
  UNLOCK();
  if (*pdVar20 == 0) {
    (*pSVar10->_vptr_SharedPtrStateBase[1])(pSVar10);
  }
  if ((char *)local_2f0._8_8_ != local_2e0._M_local_buf + 8) {
    operator_delete((void *)local_2f0._8_8_,local_2e0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,(ulong)(local_228.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,
                    CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                             local_390.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_118);
  lVar21 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1a8 + lVar21));
    lVar21 = lVar21 + -0x18;
  } while (lVar21 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0xcb2);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if ((Context *)local_2a8._0_8_ != (Context *)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,(ulong)((long)&(local_278.m_testCtx)->m_platform + 1));
  }
  if (local_278.m_contextInfo != (ContextInfo *)local_258) {
    operator_delete(local_278.m_contextInfo,(ulong)((long)(Platform **)local_258._0_8_ + 1));
  }
  if (local_248 != (pointer)local_238) {
    operator_delete(local_248,(ulong)((long)(Platform **)local_238._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  paVar11 = &local_1c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != paVar11) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    paVar11 = extraout_RAX;
  }
  return (int)paVar11;
}

Assistant:

void PerPatchDataCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	DE_ASSERT(OUTPUT_PATCH_SIZE < INPUT_PATCH_SIZE);

	const string inSizeStr		= de::toString(INPUT_PATCH_SIZE);
	const string outSizeStr		= de::toString(OUTPUT_PATCH_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp float in_v_attr;\n"
													 "\n"
													 "out highp float in_tc_attr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = " + outSizeStr + ") out;\n"
													 "\n"
													 "in highp float in_tc_attr[];\n"
													 "\n"
													 "out highp float in_te_attr[];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "patch out mediump int in_te_primitiveIDFromTCS;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "patch out mediump int in_te_patchVerticesInFromTCS;\n"
													  : "") +
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "\tin_te_primitiveIDFromTCS = gl_PrimitiveID;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "\tin_te_patchVerticesInFromTCS = gl_PatchVerticesIn;\n"
													  : "") +
													 "\n"
													 "	gl_TessLevelInner[0] = 9.0;\n"
													 "	gl_TessLevelInner[1] = 8.0;\n"
													 "\n"
													"	gl_TessLevelOuter[0] = 7.0;\n"
													"	gl_TessLevelOuter[1] = 6.0;\n"
													"	gl_TessLevelOuter[2] = 5.0;\n"
													"	gl_TessLevelOuter[3] = 4.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_QUADS) +
													 "\n"
													 "in highp float in_te_attr[];\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "patch in mediump int in_te_primitiveIDFromTCS;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "patch in mediump int in_te_patchVerticesInFromTCS;\n"
													  : string()) +
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 "uniform highp float u_xScale;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp float x = (gl_TessCoord.x*u_xScale + in_te_attr[0]) * 2.0 - 1.0;\n"
													 "	highp float y = gl_TessCoord.y*2.0 - 1.0;\n"
													 "	gl_Position = vec4(x, y, 0.0, 1.0);\n"
													 + (m_caseType == CASETYPE_PRIMITIVE_ID_TCS			? "\tbool ok = in_te_primitiveIDFromTCS == 3;\n"
													  : m_caseType == CASETYPE_PRIMITIVE_ID_TES			? "\tbool ok = gl_PrimitiveID == 3;\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TCS	? "\tbool ok = in_te_patchVerticesInFromTCS == " + inSizeStr + ";\n"
													  : m_caseType == CASETYPE_PATCH_VERTICES_IN_TES	? "\tbool ok = gl_PatchVerticesIn == " + outSizeStr + ";\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_INNER0_TES	? "\tbool ok = abs(gl_TessLevelInner[0] - 9.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_INNER1_TES	? "\tbool ok = abs(gl_TessLevelInner[1] - 8.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER0_TES	? "\tbool ok = abs(gl_TessLevelOuter[0] - 7.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER1_TES	? "\tbool ok = abs(gl_TessLevelOuter[1] - 6.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER2_TES	? "\tbool ok = abs(gl_TessLevelOuter[2] - 5.0) < 0.1f;\n"
													  : m_caseType == CASETYPE_TESS_LEVEL_OUTER3_TES	? "\tbool ok = abs(gl_TessLevelOuter[3] - 4.0) < 0.1f;\n"
													  : DE_NULL) +
													  "	in_f_color = ok ? vec4(1.0) : vec4(vec3(0.0), 1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}